

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O2

void dlep_router_remove_interface(dlep_router_if *interface)

{
  _cleanup_interface(interface);
  dlep_if_remove(&interface->interf);
  free((interface->interf).session.cfg.peer_type);
  oonf_class_free(&_router_if_class,interface);
  return;
}

Assistant:

void
dlep_router_remove_interface(struct dlep_router_if *interface) {
  /* close all sessions */
  _cleanup_interface(interface);

  /* cleanup generic interface */
  dlep_if_remove(&interface->interf);

  /* remove session */
  free(interface->interf.session.cfg.peer_type);
  oonf_class_free(&_router_if_class, interface);
}